

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZTriangleSphere.h
# Opt level: O3

void __thiscall
pzgeom::TPZTriangleSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoTriangle>_>::X<double>
          (TPZTriangleSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoTriangle>_> *this,
          TPZFMatrix<double> *cornerco,TPZVec<double> *loc,TPZVec<double> *result)

{
  ulong uVar1;
  double *pdVar2;
  ulong uVar3;
  long lVar4;
  double dVar5;
  double dVar6;
  TPZManVector<double,_3> XtminusXc;
  TPZManVector<double,_3> xqsi;
  TPZManVector<double,_3> Xsphere;
  TPZManVector<double,_3> local_110;
  double local_d8;
  TPZManVector<double,_3> local_d0;
  TPZManVector<double,_3> local_98;
  TPZManVector<double,_3> local_60;
  
  local_d0.super_TPZVec<double>._vptr_TPZVec = (_func_int **)0x0;
  TPZManVector<double,_3>::TPZManVector(&local_98,3,(double *)&local_d0);
  local_110.super_TPZVec<double>._vptr_TPZVec = (_func_int **)0x0;
  TPZManVector<double,_3>::TPZManVector(&local_d0,3,(double *)&local_110);
  TPZGeoBlend<pzgeom::TPZGeoTriangle>::X<double>
            (&this->super_TPZGeoBlend<pzgeom::TPZGeoTriangle>,cornerco,loc,
             &local_98.super_TPZVec<double>);
  local_110.super_TPZVec<double>.fStore = (double *)0x0;
  local_110.super_TPZVec<double>.fNElements = 0;
  local_110.super_TPZVec<double>.fNAlloc = 0;
  local_110.super_TPZVec<double>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01819f98;
  uVar1 = (this->fXc).fNElements;
  if ((long)uVar1 < 4) {
    local_110.super_TPZVec<double>.fStore = local_110.fExtAlloc;
    if ((long)uVar1 < 1) goto LAB_00f70e49;
  }
  else {
    local_110.super_TPZVec<double>.fStore =
         (double *)operator_new__(-(ulong)(uVar1 >> 0x3d != 0) | uVar1 * 8);
    local_110.super_TPZVec<double>.fNAlloc = uVar1;
  }
  pdVar2 = (this->fXc).fStore;
  uVar3 = 0;
  do {
    local_110.super_TPZVec<double>.fStore[uVar3] = pdVar2[uVar3];
    uVar3 = uVar3 + 1;
  } while (uVar1 != uVar3);
LAB_00f70e49:
  dVar5 = 0.0;
  lVar4 = 0;
  do {
    dVar6 = local_98.super_TPZVec<double>.fStore[lVar4] -
            local_110.super_TPZVec<double>.fStore[lVar4];
    local_d0.super_TPZVec<double>.fStore[lVar4] = dVar6;
    dVar5 = dVar5 + dVar6 * dVar6;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  local_110.super_TPZVec<double>.fNElements = uVar1;
  if (dVar5 < 0.0) {
    dVar5 = sqrt(dVar5);
  }
  else {
    dVar5 = SQRT(dVar5);
  }
  local_d8 = 0.0;
  TPZManVector<double,_3>::TPZManVector(&local_60,3,&local_d8);
  pdVar2 = result->fStore;
  lVar4 = 0;
  do {
    pdVar2[lVar4] =
         (this->fR / dVar5) * local_d0.super_TPZVec<double>.fStore[lVar4] +
         local_110.super_TPZVec<double>.fStore[lVar4];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  TPZManVector<double,_3>::~TPZManVector(&local_60);
  TPZManVector<double,_3>::~TPZManVector(&local_110);
  TPZManVector<double,_3>::~TPZManVector(&local_d0);
  TPZManVector<double,_3>::~TPZManVector(&local_98);
  return;
}

Assistant:

void X(TPZFMatrix<REAL> &cornerco,TPZVec<T> &loc,TPZVec<T> &result) const
        {
//            TPZFNMatrix<3*NNodes> coord(3,NNodes);
//            CornerCoordinates(gel, coord);
//            X(coord,loc,result);
            
            
            TPZManVector<T,3> xqsi(3,0.); // will store (x,y,z) from (qsi,eta)
            TPZManVector<T,3> XtminusXc(3,0.0); // will store (x,y,z)-xc
            GeomTriang::X(cornerco,loc,xqsi);
            TPZManVector<REAL,3> Xc = fXc;
            
            T NormValue = 0.0;
            
            for (int i = 0; i < 3; i++) {
                XtminusXc[i] = xqsi[i] - Xc[i];
                NormValue += XtminusXc[i]*XtminusXc[i];
            }
            
//            XtminusXc[0,0)= xqsi[0] - Xc[0];
//            XtminusXc(1,0)= xqsi[1] - Xc[1];
//            XtminusXc(2,0)= xqsi[2] - Xc[2];
            
            NormValue = sqrt(NormValue);
            
            TPZManVector<T,3> Xsphere(3,0.0);
            for(int i=0; i<3; i++)
            {
                result[i] = (fR/NormValue)*(XtminusXc[i])+ Xc[i];
            }
//            Xsphere[0] = (fR/NormValue)*(XtminusXc(0,0)+Xc[0]);
//            Xsphere[1] = (fR/NormValue)*(XtminusXc(1,0)+Xc[1]);
//            Xsphere[2] = (fR/NormValue)*(XtminusXc(2,0)+Xc[2]);		
//            result=Xsphere;
            
            
        }